

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freecell.c
# Opt level: O0

MovePack * freecell_movePackGet(Board *board)

{
  Card *pCVar1;
  Card *pCVar2;
  code *pcVar3;
  long lVar4;
  bool bVar5;
  byte bVar6;
  _Bool _Var7;
  uint uVar8;
  MovePack *pMVar9;
  Spot *pSVar10;
  undefined8 *puVar11;
  undefined8 uStack_1b0;
  undefined4 auStack_1a8 [2];
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  uint local_184;
  Card **local_180;
  int local_174;
  uint local_170;
  uint local_16c;
  Card **local_168;
  int local_15c;
  MovePack *local_158;
  long local_150;
  int local_144;
  MovePack *local_140;
  MovePack *local_138;
  Card *local_130;
  long local_128;
  int local_11c;
  Card *local_118;
  long local_110;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  MovePack *local_f8;
  uint local_ec;
  Card **local_e8;
  int local_dc;
  uint local_d8;
  uint local_d4;
  Card **local_d0;
  int local_c4;
  MovePack *local_c0;
  MovePack *local_b8;
  Card *local_b0;
  long local_a8;
  int local_9c;
  Card **local_98;
  int local_8c;
  undefined8 *local_88;
  Card *local_80;
  Card *card;
  unsigned_long __vla_expr0;
  Spot *pSStack_68;
  Spot *foundations [4];
  Spot *cells [4];
  byte local_1c;
  byte local_1b;
  byte local_1a;
  byte local_19;
  _Bool correctlyStacked;
  uchar tableauCount;
  uchar openCellCount;
  uchar k;
  uchar j;
  uchar i;
  MovePack *movePack;
  Board *board_local;
  
  uStack_1a0 = 0x104834;
  pMVar9 = movePack_create();
  local_1c = 0;
  bVar6 = ((gConfig.game)->id == SEAHAVENTOWERS) * '\x02' | 8;
  __vla_expr0 = (unsigned_long)&uStack_198;
  lVar4 = -(ulong)((uint)bVar6 * 8);
  puVar11 = (undefined8 *)((long)&uStack_198 + lVar4);
  local_88 = puVar11;
  card = (Card *)(ulong)bVar6;
  for (local_19 = 0; local_19 < bVar6; local_19 = local_19 + 1) {
    if (local_19 < 4) {
      *(undefined8 *)((long)&uStack_1a0 + lVar4) = 0x1048b0;
      pSVar10 = board_spotGet(board,FOUNDATION,local_19);
      foundations[(ulong)local_19 - 1] = pSVar10;
      *(undefined8 *)((long)&uStack_1a0 + lVar4) = 0x1048ce;
      pSVar10 = board_spotGet(board,CELL,local_19);
      foundations[(ulong)local_19 + 3] = pSVar10;
      if (foundations[(ulong)local_19 + 3]->cardsCount == '\0') {
        local_1c = local_1c + 1;
      }
    }
    *(undefined8 *)((long)&uStack_1a0 + lVar4) = 0x104908;
    pSVar10 = board_spotGet(board,TABLEAU,local_19);
    local_88[local_19] = pSVar10;
  }
  for (local_19 = 0; local_19 < 4; local_19 = local_19 + 1) {
    if (foundations[(ulong)local_19 + 3]->cardsCount != '\0') {
      local_98 = foundations[(ulong)local_19 + 3]->cards;
      local_8c = foundations[(ulong)local_19 + 3]->cardsCount - 1;
      if (SBORROW4((uint)foundations[(ulong)local_19 + 3]->cardsCount,1)) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      local_80 = foundations[(ulong)local_19 + 3]->cards[local_8c];
      for (local_1a = 0; pCVar2 = local_80, local_1a < bVar6; local_1a = local_1a + 1) {
        if ((*(char *)(local_88[local_1a] + 2) == '\0') &&
           ((((gConfig.game)->id != BAKERSGAMEKINGSONLY && ((gConfig.game)->id != SEAHAVENTOWERS))
            || (local_80->rank == '\r')))) {
LAB_00104a81:
          local_b8 = pMVar9;
          *(undefined4 *)((long)auStack_1a8 + lVar4) = 0xffffffff;
          *(undefined8 *)((long)&uStack_1b0 + lVar4) = 0x104ab9;
          move_create(*(MOVETYPE *)((long)&local_190 + lVar4 + 7),
                      *(SPOTTYPE *)((long)&local_190 + lVar4 + 6),
                      *(uchar *)((long)&local_190 + lVar4 + 5),*(int *)((long)&local_190 + lVar4),
                      *(SPOTTYPE *)((long)&uStack_198 + lVar4 + 7),
                      *(uchar *)((long)&uStack_198 + lVar4 + 6),*(int *)((long)&local_180 + lVar4));
          *(undefined8 *)((long)&uStack_1a0 + lVar4) = 0x104acc;
          movePack_add(*(MovePack **)((long)&local_190 + lVar4),(Move *)*puVar11);
        }
        else if (*(char *)(local_88[local_1a] + 2) != '\0') {
          local_b0 = local_80;
          local_a8 = *(long *)(local_88[local_1a] + 8);
          local_9c = *(byte *)(local_88[local_1a] + 2) - 1;
          if (SBORROW4((uint)*(byte *)(local_88[local_1a] + 2),1)) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          pCVar1 = *(Card **)(local_a8 + (long)local_9c * 8);
          *(undefined8 *)((long)&uStack_1a0 + lVar4) = 0x104a7b;
          _Var7 = freecell_validCardTableauDrop(pCVar2,pCVar1);
          if (_Var7) goto LAB_00104a81;
        }
      }
      for (local_1a = 0; local_1a < 4; local_1a = local_1a + 1) {
        if ((foundations[(ulong)local_1a - 1]->cardsCount == '\0') && (local_80->rank == '\x01')) {
          local_c0 = pMVar9;
          *(undefined4 *)((long)auStack_1a8 + lVar4) = 0xffffffff;
          *(undefined8 *)((long)&uStack_1b0 + lVar4) = 0x104b42;
          move_create(*(MOVETYPE *)((long)&local_190 + lVar4 + 7),
                      *(SPOTTYPE *)((long)&local_190 + lVar4 + 6),
                      *(uchar *)((long)&local_190 + lVar4 + 5),*(int *)((long)&local_190 + lVar4),
                      *(SPOTTYPE *)((long)&uStack_198 + lVar4 + 7),
                      *(uchar *)((long)&uStack_198 + lVar4 + 6),*(int *)((long)&local_180 + lVar4));
          *(undefined8 *)((long)&uStack_1a0 + lVar4) = 0x104b55;
          movePack_add(*(MovePack **)((long)&local_190 + lVar4),(Move *)*puVar11);
          break;
        }
        if (foundations[(ulong)local_1a - 1]->cardsCount != '\0') {
          local_d4 = (uint)local_80->rank;
          local_d0 = foundations[(ulong)local_1a - 1]->cards;
          local_c4 = foundations[(ulong)local_1a - 1]->cardsCount - 1;
          if (SBORROW4((uint)foundations[(ulong)local_1a - 1]->cardsCount,1)) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          uVar8 = (uint)foundations[(ulong)local_1a - 1]->cards[local_c4]->rank;
          local_d8 = uVar8 + 1;
          if (SCARRY4(uVar8,1)) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          if (local_80->rank == local_d8) {
            local_ec = (uint)local_80->suit;
            local_e8 = foundations[(ulong)local_1a - 1]->cards;
            local_dc = foundations[(ulong)local_1a - 1]->cardsCount - 1;
            if (SBORROW4((uint)foundations[(ulong)local_1a - 1]->cardsCount,1)) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            if ((uint)local_80->suit ==
                (uint)foundations[(ulong)local_1a - 1]->cards[local_dc]->suit) {
              local_f8 = pMVar9;
              *(undefined4 *)((long)auStack_1a8 + lVar4) = 0xffffffff;
              *(undefined8 *)((long)&uStack_1b0 + lVar4) = 0x104c93;
              move_create(*(MOVETYPE *)((long)&local_190 + lVar4 + 7),
                          *(SPOTTYPE *)((long)&local_190 + lVar4 + 6),
                          *(uchar *)((long)&local_190 + lVar4 + 5),
                          *(int *)((long)&local_190 + lVar4),
                          *(SPOTTYPE *)((long)&uStack_198 + lVar4 + 7),
                          *(uchar *)((long)&uStack_198 + lVar4 + 6),
                          *(int *)((long)&local_180 + lVar4));
              *(undefined8 *)((long)&uStack_1a0 + lVar4) = 0x104ca6;
              movePack_add(*(MovePack **)((long)&local_190 + lVar4),(Move *)*puVar11);
            }
          }
        }
      }
    }
  }
  for (local_19 = 0; local_19 < bVar6; local_19 = local_19 + 1) {
    if (*(char *)(local_88[local_19] + 2) != '\0') {
      for (local_1a = 0; local_1a < *(byte *)(local_88[local_19] + 2); local_1a = local_1a + 1) {
        local_80 = *(Card **)(*(long *)(local_88[local_19] + 8) + (ulong)local_1a * 8);
        local_100 = (uint)*(byte *)(local_88[local_19] + 2) - (uint)local_1a;
        local_fc = local_1c + 1;
        if (SCARRY4((uint)local_1c,1)) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        if (local_100 <= local_fc) {
          bVar5 = true;
          local_104 = local_1a + 1;
          if (SCARRY4((uint)local_1a,1)) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          for (local_1b = (byte)local_104; local_1b < *(byte *)(local_88[local_19] + 2);
              local_1b = local_1b + 1) {
            pCVar2 = *(Card **)(*(long *)(local_88[local_19] + 8) + (ulong)local_1b * 8);
            local_110 = *(long *)(local_88[local_19] + 8);
            local_108 = local_1b - 1;
            local_118 = pCVar2;
            if (SBORROW4((uint)local_1b,1)) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            pCVar1 = *(Card **)(local_110 + (long)local_108 * 8);
            *(undefined8 *)((long)&uStack_1a0 + lVar4) = 0x104e24;
            _Var7 = freecell_validCardTableauDrop(pCVar2,pCVar1);
            if (!_Var7) {
              bVar5 = false;
              break;
            }
          }
          if (bVar5) {
            for (local_1b = 0; pCVar2 = local_80, local_1b < bVar6; local_1b = local_1b + 1) {
              if (local_1b != local_19) {
                if (((*(char *)(local_88[local_1b] + 2) == '\0') && (local_1a != 0)) &&
                   ((((gConfig.game)->id != BAKERSGAMEKINGSONLY &&
                     ((gConfig.game)->id != SEAHAVENTOWERS)) || (local_80->rank == '\r')))) {
LAB_00104f48:
                  local_138 = pMVar9;
                  *(undefined4 *)((long)auStack_1a8 + lVar4) = 0xffffffff;
                  *(undefined8 *)((long)&uStack_1b0 + lVar4) = 0x104f7d;
                  move_create(*(MOVETYPE *)((long)&local_190 + lVar4 + 7),
                              *(SPOTTYPE *)((long)&local_190 + lVar4 + 6),
                              *(uchar *)((long)&local_190 + lVar4 + 5),
                              *(int *)((long)&local_190 + lVar4),
                              *(SPOTTYPE *)((long)&uStack_198 + lVar4 + 7),
                              *(uchar *)((long)&uStack_198 + lVar4 + 6),
                              *(int *)((long)&local_180 + lVar4));
                  *(undefined8 *)((long)&uStack_1a0 + lVar4) = 0x104f90;
                  movePack_add(*(MovePack **)((long)&local_190 + lVar4),(Move *)*puVar11);
                }
                else if (*(char *)(local_88[local_1b] + 2) != '\0') {
                  local_130 = local_80;
                  local_128 = *(long *)(local_88[local_1b] + 8);
                  local_11c = *(byte *)(local_88[local_1b] + 2) - 1;
                  if (SBORROW4((uint)*(byte *)(local_88[local_1b] + 2),1)) {
                    pcVar3 = (code *)invalidInstructionException();
                    (*pcVar3)();
                  }
                  pCVar1 = *(Card **)(local_128 + (long)local_11c * 8);
                  *(undefined8 *)((long)&uStack_1a0 + lVar4) = 0x104f42;
                  _Var7 = freecell_validCardTableauDrop(pCVar2,pCVar1);
                  if (_Var7) goto LAB_00104f48;
                }
              }
            }
          }
        }
      }
    }
  }
  local_19 = 0;
  while( true ) {
    if (3 < local_19) goto LAB_0010506d;
    if (foundations[(ulong)local_19 + 3]->cardsCount == '\0') break;
    local_19 = local_19 + 1;
  }
  for (local_1a = 0; local_1a < bVar6; local_1a = local_1a + 1) {
    if (*(char *)(local_88[local_1a] + 2) != '\0') {
      local_140 = pMVar9;
      *(undefined4 *)((long)auStack_1a8 + lVar4) = 0xffffffff;
      *(undefined8 *)((long)&uStack_1b0 + lVar4) = 0x105041;
      move_create(*(MOVETYPE *)((long)&local_190 + lVar4 + 7),
                  *(SPOTTYPE *)((long)&local_190 + lVar4 + 6),
                  *(uchar *)((long)&local_190 + lVar4 + 5),*(int *)((long)&local_190 + lVar4),
                  *(SPOTTYPE *)((long)&uStack_198 + lVar4 + 7),
                  *(uchar *)((long)&uStack_198 + lVar4 + 6),*(int *)((long)&local_180 + lVar4));
      *(undefined8 *)((long)&uStack_1a0 + lVar4) = 0x105054;
      movePack_add(*(MovePack **)((long)&local_190 + lVar4),(Move *)*puVar11);
    }
  }
LAB_0010506d:
  local_19 = 0;
  do {
    if (bVar6 <= local_19) {
      return pMVar9;
    }
    if (*(char *)(local_88[local_19] + 2) != '\0') {
      local_150 = *(long *)(local_88[local_19] + 8);
      local_144 = *(byte *)(local_88[local_19] + 2) - 1;
      if (SBORROW4((uint)*(byte *)(local_88[local_19] + 2),1)) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      local_80 = *(Card **)(*(long *)(local_88[local_19] + 8) + (long)local_144 * 8);
      for (local_1a = 0; local_1a < 4; local_1a = local_1a + 1) {
        if ((foundations[(ulong)local_1a - 1]->cardsCount == '\0') && (local_80->rank == '\x01')) {
          local_158 = pMVar9;
          *(undefined4 *)((long)auStack_1a8 + lVar4) = 0xffffffff;
          *(undefined8 *)((long)&uStack_1b0 + lVar4) = 0x105153;
          move_create(*(MOVETYPE *)((long)&local_190 + lVar4 + 7),
                      *(SPOTTYPE *)((long)&local_190 + lVar4 + 6),
                      *(uchar *)((long)&local_190 + lVar4 + 5),*(int *)((long)&local_190 + lVar4),
                      *(SPOTTYPE *)((long)&uStack_198 + lVar4 + 7),
                      *(uchar *)((long)&uStack_198 + lVar4 + 6),*(int *)((long)&local_180 + lVar4));
          *(undefined8 *)((long)&uStack_1a0 + lVar4) = 0x105166;
          movePack_add(*(MovePack **)((long)&local_190 + lVar4),(Move *)*puVar11);
          break;
        }
        if (foundations[(ulong)local_1a - 1]->cardsCount != '\0') {
          local_16c = (uint)local_80->rank;
          local_168 = foundations[(ulong)local_1a - 1]->cards;
          local_15c = foundations[(ulong)local_1a - 1]->cardsCount - 1;
          if (SBORROW4((uint)foundations[(ulong)local_1a - 1]->cardsCount,1)) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          uVar8 = (uint)foundations[(ulong)local_1a - 1]->cards[local_15c]->rank;
          local_170 = uVar8 + 1;
          if (SCARRY4(uVar8,1)) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          if (local_80->rank == local_170) {
            local_184 = (uint)local_80->suit;
            local_180 = foundations[(ulong)local_1a - 1]->cards;
            local_174 = foundations[(ulong)local_1a - 1]->cardsCount - 1;
            if (SBORROW4((uint)foundations[(ulong)local_1a - 1]->cardsCount,1)) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            if ((uint)local_80->suit ==
                (uint)foundations[(ulong)local_1a - 1]->cards[local_174]->suit) {
              local_190 = pMVar9;
              *(undefined4 *)((long)auStack_1a8 + lVar4) = 0xffffffff;
              *(undefined8 *)((long)&uStack_1b0 + lVar4) = 0x1052a4;
              move_create(*(MOVETYPE *)((long)&local_190 + lVar4 + 7),
                          *(SPOTTYPE *)((long)&local_190 + lVar4 + 6),
                          *(uchar *)((long)&local_190 + lVar4 + 5),
                          *(int *)((long)&local_190 + lVar4),
                          *(SPOTTYPE *)((long)&uStack_198 + lVar4 + 7),
                          *(uchar *)((long)&uStack_198 + lVar4 + 6),
                          *(int *)((long)&local_180 + lVar4));
              *(undefined8 *)((long)&uStack_1a0 + lVar4) = 0x1052b7;
              movePack_add(*(MovePack **)((long)&local_190 + lVar4),(Move *)*puVar11);
            }
          }
        }
      }
    }
    local_19 = local_19 + 1;
  } while( true );
}

Assistant:

MovePack * freecell_movePackGet(Board * board)
{
	MovePack * movePack = movePack_create();
	unsigned char i, j, k;
	unsigned char openCellCount=0;
	unsigned char tableauCount = gConfig.game->id==SEAHAVENTOWERS ? 10 : 8;
	bool correctlyStacked;
	Spot * cells[4];
	Spot * foundations[4];
	Spot * tableaus[tableauCount];
	Card * card;

	for(i=0;i<tableauCount;i++)
	{
		if(i<4)
		{
			foundations[i] = board_spotGet(board, FOUNDATION, i);
			cells[i] = board_spotGet(board, CELL, i);
			if(cells[i]->cardsCount==0)
				openCellCount++;
		}
		tableaus[i] = board_spotGet(board, TABLEAU, i);
	}

	// Cell
	for(i=0;i<4;i++)
	{
		if(cells[i]->cardsCount==0)
			continue;

		card = cells[i]->cards[cells[i]->cardsCount-1];

		// Cell->Tableau
		for(j=0;j<tableauCount;j++)
		{
			if((tableaus[j]->cardsCount==0 && ((gConfig.game->id!=BAKERSGAMEKINGSONLY && gConfig.game->id!=SEAHAVENTOWERS) || card->rank==13)) || (tableaus[j]->cardsCount>0 && freecell_validCardTableauDrop(card, tableaus[j]->cards[tableaus[j]->cardsCount-1])))
				movePack_add(movePack, move_create(MOVE, CELL, i, -1, TABLEAU, j, -1));
		}

		// Cell->Foundation
		for(j=0;j<4;j++)
		{
			if(foundations[j]->cardsCount==0 && card->rank==1)
			{
				movePack_add(movePack, move_create(MOVE, CELL, i, -1, FOUNDATION, j, -1));
				// All empty foundations are created equal, if moving an Ace, there is no need to entertain moving to the other foundations
				break;
			}
			else if(foundations[j]->cardsCount>0 && card->rank==foundations[j]->cards[foundations[j]->cardsCount-1]->rank+1 && card->suit==foundations[j]->cards[foundations[j]->cardsCount-1]->suit)
			{
				movePack_add(movePack, move_create(MOVE, CELL, i, -1, FOUNDATION, j, -1));
			}
		}
	}

	// Tableau->Tableau
	for(i=0;i<tableauCount;i++)
	{
		if(tableaus[i]->cardsCount==0)
			continue;

		for(j=0;j<tableaus[i]->cardsCount;j++)
		{
			card = tableaus[i]->cards[j];

			// Ensure stack not too long
			if((tableaus[i]->cardsCount-j)>(openCellCount+1))
				continue;

			// And is correctly stacked
			for(correctlyStacked=true,k=(j+1);k<tableaus[i]->cardsCount;k++)
			{
				if(!freecell_validCardTableauDrop(tableaus[i]->cards[k], tableaus[i]->cards[(k-1)]))
				{
					correctlyStacked = false;
					break;
				}
			}

			if(!correctlyStacked)
				continue;

			//printf("tableau %d at index %d has correctly ranked card: %s\n", i, j, card_print(card, false));

			for(k=0;k<tableauCount;k++)
			{
				if(k==i)
					continue;

				if((tableaus[k]->cardsCount==0 && j>0 && ((gConfig.game->id!=BAKERSGAMEKINGSONLY && gConfig.game->id!=SEAHAVENTOWERS) || card->rank==13)) ||
				   (tableaus[k]->cardsCount>0 && freecell_validCardTableauDrop(card, tableaus[k]->cards[tableaus[k]->cardsCount-1])))
				{
					movePack_add(movePack, move_create(MOVE, TABLEAU, i, j, TABLEAU, k, -1));
				}
			}
		}
	}

	// Tableau->Cell
	for(i=0;i<4;i++)
	{
		if(cells[i]->cardsCount>0)
			continue;

		for(j=0;j<tableauCount;j++)
		{
			if(tableaus[j]->cardsCount==0)
				continue;

			movePack_add(movePack, move_create(MOVE, TABLEAU, j, -1, CELL, i, -1));
		}

		break;
	}

	// Tableau->Foundation
	for(i=0;i<tableauCount;i++)
	{
		if(tableaus[i]->cardsCount==0)
			continue;

		card = tableaus[i]->cards[tableaus[i]->cardsCount-1];

		for(j=0;j<4;j++)
		{
			if(foundations[j]->cardsCount==0 && card->rank==1)
			{
				movePack_add(movePack, move_create(MOVE, TABLEAU, i, -1, FOUNDATION, j, -1));
				// All empty foundations are created equal, if moving an Ace, there is no need to entertain moving to the other foundations
				break;
			   
			}
			else if(foundations[j]->cardsCount>0 && card->rank==foundations[j]->cards[foundations[j]->cardsCount-1]->rank+1 && card->suit==foundations[j]->cards[foundations[j]->cardsCount-1]->suit)
			{
				movePack_add(movePack, move_create(MOVE, TABLEAU, i, -1, FOUNDATION, j, -1));
			}
		}
	}

	return movePack;
}